

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall spirv_cross::Compiler::Compiler(Compiler *this,ParsedIR *ir_)

{
  this->_vptr_Compiler = (_func_int **)&PTR__Compiler_003a3fd0;
  ParsedIR::ParsedIR(&this->ir);
  (this->global_variables).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->global_variables).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->global_variables).stack_storage;
  (this->global_variables).buffer_capacity = 8;
  (this->aliased_variables).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->aliased_variables).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->aliased_variables).stack_storage;
  (this->aliased_variables).buffer_capacity = 8;
  this->current_function = (SPIRFunction *)0x0;
  this->current_block = (SPIRBlock *)0x0;
  this->current_loop_level = 0;
  (this->active_interface_variables)._M_h._M_buckets =
       &(this->active_interface_variables)._M_h._M_single_bucket;
  (this->active_interface_variables)._M_h._M_bucket_count = 1;
  (this->active_interface_variables)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->active_interface_variables)._M_h._M_element_count = 0;
  (this->active_interface_variables)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->active_interface_variables)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->active_interface_variables)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->check_active_interface_variables = false;
  (this->invalid_expressions)._M_h._M_buckets = &(this->invalid_expressions)._M_h._M_single_bucket;
  (this->invalid_expressions)._M_h._M_bucket_count = 1;
  (this->invalid_expressions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->invalid_expressions)._M_h._M_element_count = 0;
  (this->invalid_expressions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size =
       0;
  this->is_force_recompile = false;
  this->is_force_recompile_forward_progress = false;
  (this->invalid_expressions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->invalid_expressions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.ptr =
       (CombinedImageSampler *)&(this->combined_image_samplers).stack_storage;
  (this->combined_image_samplers).buffer_capacity = 8;
  (this->global_struct_cache).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->global_struct_cache).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->global_struct_cache).stack_storage;
  (this->global_struct_cache).buffer_capacity = 8;
  *(undefined8 *)&(this->variable_remap_callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->variable_remap_callback).super__Function_base._M_functor + 8) = 0;
  (this->variable_remap_callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->variable_remap_callback)._M_invoker = (_Invoker_type)0x0;
  (this->forced_temporaries)._M_h._M_buckets = &(this->forced_temporaries)._M_h._M_single_bucket;
  (this->forced_temporaries)._M_h._M_bucket_count = 1;
  (this->forced_temporaries)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->forced_temporaries)._M_h._M_element_count = 0;
  (this->forced_temporaries)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->forced_temporaries)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->forced_temporaries)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->forwarded_temporaries)._M_h._M_buckets =
       &(this->forwarded_temporaries)._M_h._M_single_bucket;
  (this->forwarded_temporaries)._M_h._M_bucket_count = 1;
  (this->forwarded_temporaries)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->forwarded_temporaries)._M_h._M_element_count = 0;
  (this->forwarded_temporaries)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->forwarded_temporaries)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->forwarded_temporaries)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->suppressed_usage_tracking)._M_h._M_buckets =
       &(this->suppressed_usage_tracking)._M_h._M_single_bucket;
  (this->suppressed_usage_tracking)._M_h._M_bucket_count = 1;
  (this->suppressed_usage_tracking)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->suppressed_usage_tracking)._M_h._M_element_count = 0;
  (this->suppressed_usage_tracking)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->suppressed_usage_tracking)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->suppressed_usage_tracking)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->hoisted_temporaries)._M_h._M_buckets = &(this->hoisted_temporaries)._M_h._M_single_bucket;
  (this->hoisted_temporaries)._M_h._M_bucket_count = 1;
  (this->hoisted_temporaries)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->hoisted_temporaries)._M_h._M_element_count = 0;
  (this->hoisted_temporaries)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->hoisted_temporaries)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->hoisted_temporaries)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->forced_invariant_temporaries)._M_h._M_buckets =
       &(this->forced_invariant_temporaries)._M_h._M_single_bucket;
  (this->forced_invariant_temporaries)._M_h._M_bucket_count = 1;
  (this->forced_invariant_temporaries)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->forced_invariant_temporaries)._M_h._M_element_count = 0;
  (this->forced_invariant_temporaries)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->active_input_builtins).lower = 0;
  (this->forced_invariant_temporaries)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->forced_invariant_temporaries)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->active_input_builtins).higher._M_h._M_buckets =
       &(this->active_input_builtins).higher._M_h._M_single_bucket;
  (this->active_input_builtins).higher._M_h._M_bucket_count = 1;
  (this->active_input_builtins).higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->active_input_builtins).higher._M_h._M_element_count = 0;
  (this->active_input_builtins).higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->active_input_builtins).higher._M_h._M_rehash_policy._M_next_resize = 0;
  (this->active_input_builtins).higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->active_output_builtins).lower = 0;
  (this->active_output_builtins).higher._M_h._M_buckets =
       &(this->active_output_builtins).higher._M_h._M_single_bucket;
  (this->active_output_builtins).higher._M_h._M_bucket_count = 1;
  (this->active_output_builtins).higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->active_output_builtins).higher._M_h._M_element_count = 0;
  (this->active_output_builtins).higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->active_output_builtins).higher._M_h._M_rehash_policy._M_next_resize = 0;
  (this->active_output_builtins).higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->active_output_builtins).higher._M_h._M_single_bucket + 1) = 0;
  *(undefined8 *)((long)&this->clip_distance_count + 1) = 0;
  (this->comparison_ids)._M_h._M_buckets = &(this->comparison_ids)._M_h._M_single_bucket;
  (this->comparison_ids)._M_h._M_bucket_count = 1;
  (this->comparison_ids)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->comparison_ids)._M_h._M_element_count = 0;
  (this->comparison_ids)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->dummy_sampler_id = 0;
  this->need_subpass_input = false;
  this->need_subpass_input_ms = false;
  (this->comparison_ids)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->comparison_ids)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->function_cfgs)._M_h._M_buckets = &(this->function_cfgs)._M_h._M_single_bucket;
  (this->function_cfgs)._M_h._M_bucket_count = 1;
  (this->function_cfgs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->function_cfgs)._M_h._M_element_count = 0;
  (this->function_cfgs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->function_cfgs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->function_cfgs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->physical_storage_non_block_pointer_types).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->physical_storage_non_block_pointer_types).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->physical_storage_non_block_pointer_types).stack_storage;
  (this->physical_storage_non_block_pointer_types).buffer_capacity = 8;
  (this->physical_storage_type_to_alignment)._M_h._M_buckets =
       &(this->physical_storage_type_to_alignment)._M_h._M_single_bucket;
  (this->physical_storage_type_to_alignment)._M_h._M_bucket_count = 1;
  (this->physical_storage_type_to_alignment)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->physical_storage_type_to_alignment)._M_h._M_element_count = 0;
  (this->physical_storage_type_to_alignment)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->physical_storage_type_to_alignment)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->physical_storage_type_to_alignment)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->interlocked_resources)._M_h._M_buckets =
       &(this->interlocked_resources)._M_h._M_single_bucket;
  (this->interlocked_resources)._M_h._M_bucket_count = 1;
  (this->interlocked_resources)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->interlocked_resources)._M_h._M_element_count = 0;
  (this->interlocked_resources)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->interlocked_is_complex = false;
  (this->interlocked_resources)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->interlocked_resources)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->declared_block_names)._M_h._M_buckets = &(this->declared_block_names)._M_h._M_single_bucket
  ;
  (this->declared_block_names)._M_h._M_bucket_count = 1;
  (this->declared_block_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->declared_block_names)._M_h._M_element_count = 0;
  (this->declared_block_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->declared_block_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->declared_block_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ParsedIR::operator=(&this->ir,ir_);
  parse_fixup(this);
  return;
}

Assistant:

Compiler::Compiler(const ParsedIR &ir_)
{
	set_ir(ir_);
}